

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# local_cid.c
# Opt level: O1

void quicly_local_cid_on_sent(quicly_local_cid_set_t *set,size_t num_sent)

{
  quicly_local_cid_t *pqVar1;
  undefined8 uVar2;
  uint64_t uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  uint64_t uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  en_quicly_local_cid_state_t eVar12;
  undefined4 uVar13;
  en_quicly_local_cid_state_t eVar14;
  undefined4 uVar15;
  quicly_local_cid_t *pqVar16;
  size_t sVar17;
  
  if (set->_size < num_sent) {
    __assert_fail("num_sent <= set->_size",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/lib/local_cid.c"
                  ,0x84,"void quicly_local_cid_on_sent(quicly_local_cid_set_t *, size_t)");
  }
  if (num_sent != 0) {
    pqVar16 = set->cids;
    sVar17 = num_sent;
    do {
      if (pqVar16->state != QUICLY_LOCAL_CID_STATE_PENDING) {
        __assert_fail("set->cids[i].state == QUICLY_LOCAL_CID_STATE_PENDING",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/lib/local_cid.c"
                      ,0x88,"void quicly_local_cid_on_sent(quicly_local_cid_set_t *, size_t)");
      }
      pqVar16->state = QUICLY_LOCAL_CID_STATE_INFLIGHT;
      pqVar16 = pqVar16 + 1;
      sVar17 = sVar17 - 1;
    } while (sVar17 != 0);
  }
  if (num_sent < set->_size) {
    pqVar16 = set->cids;
    sVar17 = num_sent;
    do {
      if (pqVar16[num_sent].state != QUICLY_LOCAL_CID_STATE_PENDING) {
        return;
      }
      pqVar1 = pqVar16 + num_sent;
      uVar2 = *(undefined8 *)(pqVar16->stateless_reset_token + 0xb);
      eVar14 = pqVar16->state;
      uVar15 = *(undefined4 *)&pqVar16->field_0x4;
      uVar3 = pqVar16->sequence;
      uVar4 = *(undefined8 *)(pqVar16->cid).cid;
      uVar5 = *(undefined8 *)((pqVar16->cid).cid + 8);
      uVar6 = *(undefined8 *)((pqVar16->cid).cid + 0x10);
      uVar7 = *(undefined8 *)(pqVar16->stateless_reset_token + 3);
      *(undefined8 *)(pqVar16->stateless_reset_token + 0xb) =
           *(undefined8 *)(pqVar1->stateless_reset_token + 0xb);
      eVar12 = pqVar1->state;
      uVar13 = *(undefined4 *)&pqVar1->field_0x4;
      uVar8 = pqVar1->sequence;
      uVar9 = *(undefined8 *)(pqVar1->cid).cid;
      uVar10 = *(undefined8 *)((pqVar1->cid).cid + 8);
      uVar11 = *(undefined8 *)(pqVar1->stateless_reset_token + 3);
      *(undefined8 *)((pqVar16->cid).cid + 0x10) = *(undefined8 *)((pqVar1->cid).cid + 0x10);
      *(undefined8 *)(pqVar16->stateless_reset_token + 3) = uVar11;
      *(undefined8 *)(pqVar16->cid).cid = uVar9;
      *(undefined8 *)((pqVar16->cid).cid + 8) = uVar10;
      pqVar16->state = eVar12;
      *(undefined4 *)&pqVar16->field_0x4 = uVar13;
      pqVar16->sequence = uVar8;
      *(undefined8 *)(pqVar1->stateless_reset_token + 0xb) = uVar2;
      *(undefined8 *)((pqVar1->cid).cid + 0x10) = uVar6;
      *(undefined8 *)(pqVar1->stateless_reset_token + 3) = uVar7;
      *(undefined8 *)(pqVar1->cid).cid = uVar4;
      *(undefined8 *)((pqVar1->cid).cid + 8) = uVar5;
      pqVar1->state = eVar14;
      *(undefined4 *)&pqVar1->field_0x4 = uVar15;
      pqVar1->sequence = uVar3;
      sVar17 = sVar17 + 1;
      pqVar16 = pqVar16 + 1;
    } while (sVar17 < set->_size);
  }
  return;
}

Assistant:

void quicly_local_cid_on_sent(quicly_local_cid_set_t *set, size_t num_sent)
{
    assert(num_sent <= set->_size);

    /* first, mark the first `num_sent` CIDs as INFLIGHT */
    for (size_t i = 0; i < num_sent; i++) {
        assert(set->cids[i].state == QUICLY_LOCAL_CID_STATE_PENDING);
        set->cids[i].state = QUICLY_LOCAL_CID_STATE_INFLIGHT;
    }

    /* then move the remaining PENDING CIDs (if any) to the front of the array */
    for (size_t i = num_sent; i < set->_size; i++) {
        if (set->cids[i].state != QUICLY_LOCAL_CID_STATE_PENDING)
            break;
        swap_cids(&set->cids[i], &set->cids[i - num_sent]);
    }
}